

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O0

int mbedtls_des_setkey_dec(mbedtls_des_context *ctx,uchar *key)

{
  uint32_t uVar1;
  uint32_t t_1;
  uint32_t t;
  int i;
  uchar *key_local;
  mbedtls_des_context *ctx_local;
  
  mbedtls_des_setkey(ctx->sk,key);
  for (t_1 = 0; (int)t_1 < 0x10; t_1 = t_1 + 2) {
    uVar1 = ctx->sk[(int)t_1];
    ctx->sk[(int)t_1] = ctx->sk[(int)(0x1e - t_1)];
    ctx->sk[(int)(0x1e - t_1)] = uVar1;
    uVar1 = ctx->sk[(int)(t_1 + 1)];
    ctx->sk[(int)(t_1 + 1)] = ctx->sk[(int)(0x1f - t_1)];
    ctx->sk[(int)(0x1f - t_1)] = uVar1;
  }
  return 0;
}

Assistant:

int mbedtls_des_setkey_dec( mbedtls_des_context *ctx, const unsigned char key[MBEDTLS_DES_KEY_SIZE] )
{
    int i;

    mbedtls_des_setkey( ctx->sk, key );

    for( i = 0; i < 16; i += 2 )
    {
        SWAP( ctx->sk[i    ], ctx->sk[30 - i] );
        SWAP( ctx->sk[i + 1], ctx->sk[31 - i] );
    }

    return( 0 );
}